

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaShrink6.c
# Opt level: O0

Shr_Man_t * Shr_ManAlloc(Gia_Man_t *pGia)

{
  int iVar1;
  Shr_Man_t *pSVar2;
  Vec_Wrd_t *pVVar3;
  Vec_Int_t *pVVar4;
  Gia_Man_t *pGVar5;
  char *pcVar6;
  Bdc_Man_t *pBVar7;
  Rsb_Man_t *pRVar8;
  Shr_Man_t *p;
  Gia_Man_t *pGia_local;
  
  pSVar2 = (Shr_Man_t *)calloc(1,0x80);
  pSVar2->nDivMax = 0x40;
  iVar1 = Gia_ManObjNum(pGia);
  pSVar2->nNewSize = iVar1 << 1;
  pSVar2->pGia = pGia;
  pVVar3 = Vec_WrdAlloc(1000);
  pSVar2->vFanMem = pVVar3;
  Vec_WrdPush(pSVar2->vFanMem,0xffffffffffffffff);
  pVVar4 = Vec_IntStart(pSVar2->nNewSize);
  pSVar2->vObj2Fan = pVVar4;
  pVVar4 = Vec_IntAlloc(1000);
  pSVar2->vDivs = pVVar4;
  pVVar4 = Vec_IntAlloc(1000);
  pSVar2->vPrio = pVVar4;
  pVVar3 = Vec_WrdStart(pSVar2->nNewSize);
  pSVar2->vTruths = pVVar3;
  pVVar3 = Vec_WrdAlloc(100);
  pSVar2->vDivTruths = pVVar3;
  pVVar4 = Vec_IntAlloc(6);
  pSVar2->vDivResub = pVVar4;
  pVVar4 = Vec_IntAlloc(6);
  pSVar2->vLeaves = pVVar4;
  pGVar5 = Gia_ManStart(pSVar2->nNewSize);
  pSVar2->pNew = pGVar5;
  pcVar6 = Abc_UtilStrsav(pGia->pName);
  pSVar2->pNew->pName = pcVar6;
  pcVar6 = Abc_UtilStrsav(pGia->pSpec);
  pSVar2->pNew->pSpec = pcVar6;
  Gia_ManHashAlloc(pSVar2->pNew);
  Gia_ManCleanLevels(pSVar2->pNew,pSVar2->nNewSize);
  pSVar2->pNew->nObjs = pSVar2->nNewSize;
  Gia_ManIncrementTravId(pSVar2->pNew);
  pSVar2->pNew->nObjs = 1;
  (pSVar2->Pars).nVarsMax = 6;
  (pSVar2->Pars).fVerbose = 0;
  pBVar7 = Bdc_ManAlloc(&pSVar2->Pars);
  pSVar2->pManDec = pBVar7;
  pRVar8 = Rsb_ManAlloc(6,pSVar2->nDivMax,4,1);
  pSVar2->pManRsb = pRVar8;
  return pSVar2;
}

Assistant:

Shr_Man_t * Shr_ManAlloc( Gia_Man_t * pGia )
{
    Shr_Man_t * p;
    p = ABC_CALLOC( Shr_Man_t, 1 );
    p->nDivMax     = 64;
    p->nNewSize    = 2 * Gia_ManObjNum(pGia);
    p->pGia        = pGia;
    p->vFanMem     = Vec_WrdAlloc( 1000 );   Vec_WrdPush(p->vFanMem, -1); 
    p->vObj2Fan    = Vec_IntStart( p->nNewSize );
    p->vDivs       = Vec_IntAlloc( 1000 );
    p->vPrio       = Vec_IntAlloc( 1000 );
    p->vTruths     = Vec_WrdStart( p->nNewSize );
    p->vDivTruths  = Vec_WrdAlloc( 100 );
    p->vDivResub   = Vec_IntAlloc( 6 );
    p->vLeaves     = Vec_IntAlloc( 6 );
    // start new manager
    p->pNew        = Gia_ManStart( p->nNewSize );
    p->pNew->pName = Abc_UtilStrsav( pGia->pName );
    p->pNew->pSpec = Abc_UtilStrsav( pGia->pSpec );
    Gia_ManHashAlloc( p->pNew );
    Gia_ManCleanLevels( p->pNew, p->nNewSize );
    // allocate traversal IDs
    p->pNew->nObjs = p->nNewSize;
    Gia_ManIncrementTravId( p->pNew );
    p->pNew->nObjs = 1;
    // start decompostion
    p->Pars.nVarsMax = 6;
    p->Pars.fVerbose = 0;
    p->pManDec = Bdc_ManAlloc( &p->Pars );
    p->pManRsb = Rsb_ManAlloc( 6, p->nDivMax, 4, 1 );
    return p;
}